

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

void Curl_failf(Curl_easy *data,char *fmt,...)

{
  long lVar1;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_1f8 [16];
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  char local_148 [8];
  char error [258];
  size_t len;
  va_list ap;
  char *fmt_local;
  Curl_easy *data_local;
  
  if (in_AL != '\0') {
    local_1c8 = in_XMM0_Qa;
    local_1b8 = in_XMM1_Qa;
    local_1a8 = in_XMM2_Qa;
    local_198 = in_XMM3_Qa;
    local_188 = in_XMM4_Qa;
    local_178 = in_XMM5_Qa;
    local_168 = in_XMM6_Qa;
    local_158 = in_XMM7_Qa;
  }
  if ((((data->set).verbose & 1U) != 0) || ((data->set).errorbuffer != (char *)0x0)) {
    ap[0].overflow_arg_area = local_1f8;
    ap[0]._0_8_ = &stack0x00000008;
    len._4_4_ = 0x30;
    len._0_4_ = 0x10;
    local_1e8 = in_RDX;
    local_1e0 = in_RCX;
    local_1d8 = in_R8;
    local_1d0 = in_R9;
    curl_mvsnprintf(local_148,0x100,fmt,(__va_list_tag *)&len);
    register0x00000000 = strlen(local_148);
    if (((data->set).errorbuffer != (char *)0x0) && (((data->state).errorbuf & 1U) == 0)) {
      strcpy((data->set).errorbuffer,local_148);
      (data->state).errorbuf = true;
    }
    if (((data->set).verbose & 1U) != 0) {
      local_148[stack0xffffffffffffffc0] = '\n';
      lVar1 = stack0xffffffffffffffc0 + 1;
      unique0x10000241 = stack0xffffffffffffffc0 + 1;
      local_148[lVar1] = '\0';
      Curl_debug(data,CURLINFO_TEXT,local_148,stack0xffffffffffffffc0,(connectdata *)0x0);
    }
  }
  return;
}

Assistant:

void Curl_failf(struct Curl_easy *data, const char *fmt, ...)
{
  if(data->set.verbose || data->set.errorbuffer) {
    va_list ap;
    size_t len;
    char error[CURL_ERROR_SIZE + 2];
    va_start(ap, fmt);
    vsnprintf(error, CURL_ERROR_SIZE, fmt, ap);
    len = strlen(error);

    if(data->set.errorbuffer && !data->state.errorbuf) {
      strcpy(data->set.errorbuffer, error);
      data->state.errorbuf = TRUE; /* wrote error string */
    }
    if(data->set.verbose) {
      error[len] = '\n';
      error[++len] = '\0';
      Curl_debug(data, CURLINFO_TEXT, error, len, NULL);
    }
    va_end(ap);
  }
}